

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O2

void ImGui_ImplOpenGL3_SaveState(int id)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  mapped_type *pmVar4;
  key_type local_4;
  
  pmVar4 = std::map<int,_State,_std::less<int>,_std::allocator<std::pair<const_int,_State>_>_>::
           operator[](&g_state,&local_4);
  *(GLuint *)&pmVar4->Window = g_FontTexture;
  *(GLuint *)((long)&pmVar4->Window + 4) = g_ShaderHandle;
  *(GLuint *)&pmVar4->Time = g_VertHandle;
  *(GLuint *)((long)&pmVar4->Time + 4) = g_FragHandle;
  uVar1 = g_AttribLocationTex._1_1_;
  uVar2 = g_AttribLocationTex._2_1_;
  uVar3 = g_AttribLocationTex._3_1_;
  pmVar4->MousePressed[0] = (bool)(undefined1)g_AttribLocationTex;
  pmVar4->MousePressed[1] = (bool)uVar1;
  pmVar4->MousePressed[2] = (bool)uVar2;
  pmVar4->field_0x13 = uVar3;
  *(int *)&pmVar4->field_0x14 = g_AttribLocationProjMtx;
  *(int *)pmVar4->MouseCursors = g_AttribLocationVtxPos;
  *(int *)((long)pmVar4->MouseCursors + 4) = g_AttribLocationVtxUV;
  *(int *)(pmVar4->MouseCursors + 1) = g_AttribLocationVtxColor;
  *(uint *)((long)pmVar4->MouseCursors + 0xc) = g_VboHandle;
  *(uint *)(pmVar4->MouseCursors + 2) = g_ElementsHandle;
  return;
}

Assistant:

void ImGui_ImplOpenGL3_SaveState(int id) {
    auto & dst = g_state[id];

    dst.FontTexture             = g_FontTexture;
    dst.FontTexture             = g_FontTexture;
    dst.ShaderHandle            = g_ShaderHandle;
    dst.VertHandle              = g_VertHandle;
    dst.FragHandle              = g_FragHandle;
    dst.AttribLocationTex       = g_AttribLocationTex;
    dst.AttribLocationProjMtx   = g_AttribLocationProjMtx;
    dst.AttribLocationVtxPos    = g_AttribLocationVtxPos;
    dst.AttribLocationVtxUV     = g_AttribLocationVtxUV;
    dst.AttribLocationVtxColor  = g_AttribLocationVtxColor;
    dst.VboHandle               = g_VboHandle;
    dst.ElementsHandle          = g_ElementsHandle;
}